

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.cc
# Opt level: O2

void __thiscall fasttext::Vector::mul(Vector *this,QMatrix *A,Vector *vec)

{
  uint __line;
  int64_t iVar1;
  pointer pfVar2;
  char *__assertion;
  long i;
  real rVar3;
  
  iVar1 = QMatrix::getM(A);
  if (iVar1 == (long)(this->data_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(this->data_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_start >> 2) {
    iVar1 = QMatrix::getN(A);
    if (iVar1 == (long)(vec->data_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)(vec->data_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_start >> 2) {
      pfVar2 = (this->data_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start;
      for (i = 0; i < (long)(this->data_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_finish - (long)pfVar2 >> 2; i = i + 1) {
        rVar3 = QMatrix::dotRow(A,vec,i);
        pfVar2 = (this->data_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pfVar2[i] = rVar3;
      }
      return;
    }
    __assertion = "A.getN() == vec.size()";
    __line = 0x60;
  }
  else {
    __assertion = "A.getM() == size()";
    __line = 0x5f;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Whadup[P]weightedFastText/src/vector.cc"
                ,__line,"void fasttext::Vector::mul(const QMatrix &, const Vector &)");
}

Assistant:

void Vector::mul(const QMatrix& A, const Vector& vec) {
  assert(A.getM() == size());
  assert(A.getN() == vec.size());
  for (int64_t i = 0; i < size(); i++) {
    data_[i] = A.dotRow(vec, i);
  }
}